

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O1

double __thiscall
NEST::LArNEST::GetDensity
          (LArNEST *this,double Kelvin,double bara,bool *inGas,uint64_t evtNum,double molarMass)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = log(Kelvin);
  dVar2 = exp(dVar2 * -6.539938 + -1464.718291 / Kelvin + 45.97394);
  if ((bara < dVar2) || (*inGas == true)) {
    dVar3 = bara * 100000.0;
    dVar4 = pow(this->fRIdealGas * Kelvin,3.0);
    dVar5 = Kelvin * this->fRIdealGas;
    dVar3 = (1.0 / (dVar4 / (dVar5 * dVar5 * dVar3 + this->fRealGasA * dVar3 * dVar3) +
                   this->fRealGasB)) * molarMass * 1e-06;
    bVar1 = true;
    if ((evtNum == 0) && (bara < dVar2)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\nWARNING: ARGON GAS PHASE. IS THAT WHAT YOU WANTED?\n",0x34
                );
    }
  }
  else {
    dVar3 = 1.4;
    bVar1 = false;
  }
  *inGas = bVar1;
  return dVar3;
}

Assistant:

double LArNEST::GetDensity(double Kelvin, double bara, bool &inGas,
                           uint64_t evtNum, double molarMass) {
  // currently only for fixed pressure
  // (the saturated vapor pressure); will add
  // pressure dependence later
  double VaporP_bar =
      exp(45.973940 - (1464.718291 / Kelvin) - (6.539938 * log(Kelvin)));
  if (bara < VaporP_bar || inGas) {
    double p_Pa = bara * 1e5;
    double density =
        1. /
        (pow(fRIdealGas * Kelvin, 3.) /
             (p_Pa * pow(fRIdealGas * Kelvin, 2.) + fRealGasA * p_Pa * p_Pa) +
         fRealGasB) *
        molarMass * 1e-6;  // Van der Waals equation, mol/m^3
    if (bara < VaporP_bar && evtNum == 0)
      // TODO: get rid of these output statements
      std::cerr << "\nWARNING: ARGON GAS PHASE. IS THAT WHAT YOU WANTED?\n";
    inGas = true;
    return density;
  } else {
    inGas = false;
    return 1.4;
  }
}